

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

fdb_status wal_init(filemgr *file,int nbucket)

{
  size_t sVar1;
  wal_shard *pwVar2;
  filemgr *in_RDI;
  int i;
  size_t num_shards;
  undefined4 in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  
  atomic_init_uint8_t((atomic<unsigned_char> *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (uint8_t)(in_stack_ffffffffffffffdc >> 0x18));
  in_RDI->wal->flag = '\x01';
  atomic_init_uint32_t
            ((atomic<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc);
  atomic_init_uint32_t
            ((atomic<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc);
  atomic_init_uint64_t
            ((atomic<unsigned_long> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  atomic_init_uint64_t
            ((atomic<unsigned_long> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  in_RDI->wal->wal_dirty = '\0';
  list_init(&in_RDI->wal->txn_list);
  pthread_spin_init(&in_RDI->wal->lock,1);
  if (in_RDI->config->num_wal_shards == 0) {
    in_RDI->wal->num_shards = 0xb;
  }
  else {
    in_RDI->wal->num_shards = (ulong)in_RDI->config->num_wal_shards;
  }
  sVar1 = wal_get_num_shards(in_RDI);
  pwVar2 = (wal_shard *)malloc(sVar1 * 0x18);
  in_RDI->wal->key_shards = pwVar2;
  if (in_RDI->config->seqtree_opt == '\x01') {
    pwVar2 = (wal_shard *)malloc(sVar1 * 0x18);
    in_RDI->wal->seq_shards = pwVar2;
  }
  else {
    in_RDI->wal->seq_shards = (wal_shard *)0x0;
  }
  iVar3 = (int)sVar1;
  while (iVar3 = iVar3 + -1, -1 < iVar3) {
    avl_init(&in_RDI->wal->key_shards[iVar3]._map,(void *)0x0);
    pthread_spin_init(&in_RDI->wal->key_shards[iVar3].lock,1);
    if (in_RDI->config->seqtree_opt == '\x01') {
      avl_init(&in_RDI->wal->seq_shards[iVar3]._map,(void *)0x0);
      pthread_spin_init(&in_RDI->wal->seq_shards[iVar3].lock,1);
    }
  }
  avl_init(&in_RDI->wal->wal_snapshot_tree,(void *)0x0);
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status wal_init(struct filemgr *file, int nbucket)
{
    size_t num_shards;
    atomic_init_uint8_t(&file->wal->isPopulated, 0);
    file->wal->flag = WAL_FLAG_INITIALIZED;
    atomic_init_uint32_t(&file->wal->size, 0);
    atomic_init_uint32_t(&file->wal->num_flushable, 0);
    atomic_init_uint64_t(&file->wal->datasize, 0);
    atomic_init_uint64_t(&file->wal->mem_overhead, 0);
    file->wal->wal_dirty = FDB_WAL_CLEAN;

    list_init(&file->wal->txn_list);
    spin_init(&file->wal->lock);

    if (file->config->num_wal_shards) {
        file->wal->num_shards = file->config->num_wal_shards;
    } else {
        file->wal->num_shards = DEFAULT_NUM_WAL_PARTITIONS;
    }

    num_shards = wal_get_num_shards(file);
    file->wal->key_shards = (wal_shard *)
        malloc(sizeof(struct wal_shard) * num_shards);

    if (file->config->seqtree_opt == FDB_SEQTREE_USE) {
        file->wal->seq_shards = (wal_shard *)
            malloc(sizeof(struct wal_shard) * num_shards);
    } else {
        file->wal->seq_shards = NULL;
    }

    for (int i = num_shards - 1; i >= 0; --i) {
        avl_init(&file->wal->key_shards[i]._map, NULL);
        spin_init(&file->wal->key_shards[i].lock);
        if (file->config->seqtree_opt == FDB_SEQTREE_USE) {
            avl_init(&file->wal->seq_shards[i]._map, NULL);
            spin_init(&file->wal->seq_shards[i].lock);
        }
    }

    avl_init(&file->wal->wal_snapshot_tree, NULL);

    DBG("wal item size %ld\n", sizeof(struct wal_item));
    return FDB_RESULT_SUCCESS;
}